

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O2

int __thiscall QDtls::shutdown(QDtls *this,int __fd,int __how)

{
  long *plVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 == (long *)0x0) {
    iVar5 = 0;
  }
  else {
    if (lVar4 == 0) {
      lVar2 = *(long *)(*plVar1 + -0x60);
      tr((QString *)&QStack_48,"Invalid (nullptr) socket",(char *)0x0,-1);
      lVar4 = *(long *)((long)plVar1 + lVar2);
      uStack_50 = 1;
    }
    else {
      cVar3 = (**(code **)(*plVar1 + 0x98))(plVar1);
      if (cVar3 != '\0') {
        (**(code **)(*plVar1 + 200))(plVar1,lVar4);
        iVar5 = (int)CONCAT71((int7)((ulong)lVar4 >> 8),1);
        goto LAB_0023a373;
      }
      lVar2 = *(long *)(*plVar1 + -0x60);
      tr((QString *)&QStack_48,"Cannot send shutdown alert, not encrypted",(char *)0x0,-1);
      lVar4 = *(long *)((long)plVar1 + lVar2);
      uStack_50 = 2;
    }
    iVar5 = 0;
    (**(code **)(lVar4 + 0x10))((long)plVar1 + lVar2,uStack_50,&QStack_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  }
LAB_0023a373:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::shutdown(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters,
                              tr("Invalid (nullptr) socket"));
        return false;
    }

    if (!backend->isConnectionEncrypted()) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("Cannot send shutdown alert, not encrypted"));
        return false;
    }

    backend->sendShutdownAlert(socket);
    return true;
}